

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nucleus.cxx
# Opt level: O0

NucleusPtr trento::Nucleus::create(string *species,double nucleon_dmin)

{
  bool bVar1;
  DeformedWoodsSaxonNucleus *this;
  void *pvVar2;
  invalid_argument *piVar3;
  __uniq_ptr_data<trento::Nucleus,_std::default_delete<trento::Nucleus>,_true,_true> in_RDI;
  pointer in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  double in_stack_ffffffffffffff38;
  Deuteron *in_stack_ffffffffffffff40;
  double in_stack_ffffffffffffff48;
  double in_stack_ffffffffffffff50;
  double in_stack_ffffffffffffff58;
  DeformedWoodsSaxonNucleus *in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff68;
  WoodsSaxonNucleus *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  string local_48 [72];
  
  bVar1 = std::operator==(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
  if (bVar1) {
    operator_new(0x28);
    Proton::Proton((Proton *)in_stack_ffffffffffffff30);
    std::unique_ptr<trento::Nucleus,std::default_delete<trento::Nucleus>>::
    unique_ptr<std::default_delete<trento::Nucleus>,void>
              ((unique_ptr<trento::Nucleus,_std::default_delete<trento::Nucleus>_> *)
               in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  }
  else {
    bVar1 = std::operator==(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
    if (bVar1) {
      operator_new(0x38);
      Deuteron::Deuteron(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                         (double)in_stack_ffffffffffffff30);
      std::unique_ptr<trento::Nucleus,std::default_delete<trento::Nucleus>>::
      unique_ptr<std::default_delete<trento::Nucleus>,void>
                ((unique_ptr<trento::Nucleus,_std::default_delete<trento::Nucleus>_> *)
                 in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    }
    else {
      bVar1 = std::operator==(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
      if (bVar1) {
        operator_new(0xa0);
        WoodsSaxonNucleus::WoodsSaxonNucleus
                  (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                   (double)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                   in_stack_ffffffffffffff50);
        std::unique_ptr<trento::Nucleus,std::default_delete<trento::Nucleus>>::
        unique_ptr<std::default_delete<trento::Nucleus>,void>
                  ((unique_ptr<trento::Nucleus,_std::default_delete<trento::Nucleus>_> *)
                   in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      }
      else {
        bVar1 = std::operator==(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
        if (bVar1) {
          operator_new(0x58);
          DeformedWoodsSaxonNucleus::DeformedWoodsSaxonNucleus
                    (in_stack_ffffffffffffff60,(size_t)in_stack_ffffffffffffff58,
                     in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                     (double)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                     (double)in_stack_ffffffffffffff30);
          std::unique_ptr<trento::Nucleus,std::default_delete<trento::Nucleus>>::
          unique_ptr<std::default_delete<trento::Nucleus>,void>
                    ((unique_ptr<trento::Nucleus,_std::default_delete<trento::Nucleus>_> *)
                     in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        }
        else {
          bVar1 = std::operator==(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
          if (bVar1) {
            operator_new(0xa0);
            WoodsSaxonNucleus::WoodsSaxonNucleus
                      (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                       (double)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                       in_stack_ffffffffffffff50);
            std::unique_ptr<trento::Nucleus,std::default_delete<trento::Nucleus>>::
            unique_ptr<std::default_delete<trento::Nucleus>,void>
                      ((unique_ptr<trento::Nucleus,_std::default_delete<trento::Nucleus>_> *)
                       in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
          }
          else {
            bVar1 = std::operator==(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
            if (bVar1) {
              operator_new(0x58);
              DeformedWoodsSaxonNucleus::DeformedWoodsSaxonNucleus
                        (in_stack_ffffffffffffff60,(size_t)in_stack_ffffffffffffff58,
                         in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                         (double)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                         (double)in_stack_ffffffffffffff30);
              std::unique_ptr<trento::Nucleus,std::default_delete<trento::Nucleus>>::
              unique_ptr<std::default_delete<trento::Nucleus>,void>
                        ((unique_ptr<trento::Nucleus,_std::default_delete<trento::Nucleus>_> *)
                         in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
            }
            else {
              bVar1 = std::operator==(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
              if (bVar1) {
                pvVar2 = operator_new(0xa0);
                WoodsSaxonNucleus::WoodsSaxonNucleus
                          (in_stack_ffffffffffffff70,(size_t)pvVar2,
                           (double)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                           in_stack_ffffffffffffff50);
                std::unique_ptr<trento::Nucleus,std::default_delete<trento::Nucleus>>::
                unique_ptr<std::default_delete<trento::Nucleus>,void>
                          ((unique_ptr<trento::Nucleus,_std::default_delete<trento::Nucleus>_> *)
                           in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
              }
              else {
                bVar1 = std::operator==(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28)
                ;
                if (bVar1) {
                  this = (DeformedWoodsSaxonNucleus *)operator_new(0x58);
                  DeformedWoodsSaxonNucleus::DeformedWoodsSaxonNucleus
                            (this,(size_t)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                             in_stack_ffffffffffffff48,(double)in_stack_ffffffffffffff40,
                             in_stack_ffffffffffffff38,(double)in_stack_ffffffffffffff30);
                  std::unique_ptr<trento::Nucleus,std::default_delete<trento::Nucleus>>::
                  unique_ptr<std::default_delete<trento::Nucleus>,void>
                            ((unique_ptr<trento::Nucleus,_std::default_delete<trento::Nucleus>_> *)
                             in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
                }
                else {
                  bVar1 = std::operator==(in_stack_ffffffffffffff30,
                                          (char *)in_stack_ffffffffffffff28);
                  if (bVar1) {
                    pvVar2 = operator_new(0xa0);
                    WoodsSaxonNucleus::WoodsSaxonNucleus
                              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                               (double)in_stack_ffffffffffffff60,(double)pvVar2,
                               in_stack_ffffffffffffff50);
                    std::unique_ptr<trento::Nucleus,std::default_delete<trento::Nucleus>>::
                    unique_ptr<std::default_delete<trento::Nucleus>,void>
                              ((unique_ptr<trento::Nucleus,_std::default_delete<trento::Nucleus>_> *
                               )in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
                  }
                  else {
                    bVar1 = std::operator==(in_stack_ffffffffffffff30,
                                            (char *)in_stack_ffffffffffffff28);
                    if (bVar1) {
                      pvVar2 = operator_new(0x58);
                      DeformedWoodsSaxonNucleus::DeformedWoodsSaxonNucleus
                                (in_stack_ffffffffffffff60,(size_t)in_stack_ffffffffffffff58,
                                 (double)pvVar2,in_stack_ffffffffffffff48,
                                 (double)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                                 (double)in_stack_ffffffffffffff30);
                      std::unique_ptr<trento::Nucleus,std::default_delete<trento::Nucleus>>::
                      unique_ptr<std::default_delete<trento::Nucleus>,void>
                                ((unique_ptr<trento::Nucleus,_std::default_delete<trento::Nucleus>_>
                                  *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
                    }
                    else {
                      bVar1 = std::operator==(in_stack_ffffffffffffff30,
                                              (char *)in_stack_ffffffffffffff28);
                      if (bVar1) {
                        pvVar2 = operator_new(0x58);
                        DeformedWoodsSaxonNucleus::DeformedWoodsSaxonNucleus
                                  (in_stack_ffffffffffffff60,(size_t)in_stack_ffffffffffffff58,
                                   in_stack_ffffffffffffff50,(double)pvVar2,
                                   (double)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                                   (double)in_stack_ffffffffffffff30);
                        std::unique_ptr<trento::Nucleus,std::default_delete<trento::Nucleus>>::
                        unique_ptr<std::default_delete<trento::Nucleus>,void>
                                  ((unique_ptr<trento::Nucleus,_std::default_delete<trento::Nucleus>_>
                                    *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
                      }
                      else {
                        bVar1 = std::operator==(in_stack_ffffffffffffff30,
                                                (char *)in_stack_ffffffffffffff28);
                        if (!bVar1) {
                          bVar1 = hdf5::filename_is_hdf5((string *)in_stack_ffffffffffffff60);
                          if (!bVar1) {
                            piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
                            std::operator+(in_stack_ffffffffffffff78,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)in_stack_ffffffffffffff70);
                            std::invalid_argument::invalid_argument(piVar3,local_48);
                            __cxa_throw(piVar3,&std::invalid_argument::typeinfo,
                                        std::invalid_argument::~invalid_argument);
                          }
                          piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
                          std::invalid_argument::invalid_argument
                                    (piVar3,"HDF5 output was not compiled");
                          __cxa_throw(piVar3,&std::invalid_argument::typeinfo,
                                      std::invalid_argument::~invalid_argument);
                        }
                        pvVar2 = operator_new(0x58);
                        DeformedWoodsSaxonNucleus::DeformedWoodsSaxonNucleus
                                  (in_stack_ffffffffffffff60,(size_t)in_stack_ffffffffffffff58,
                                   in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                                   (double)pvVar2,in_stack_ffffffffffffff38,
                                   (double)in_stack_ffffffffffffff30);
                        std::unique_ptr<trento::Nucleus,std::default_delete<trento::Nucleus>>::
                        unique_ptr<std::default_delete<trento::Nucleus>,void>
                                  ((unique_ptr<trento::Nucleus,_std::default_delete<trento::Nucleus>_>
                                    *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (__uniq_ptr_data<trento::Nucleus,_std::default_delete<trento::Nucleus>,_true,_true>)
         (tuple<trento::Nucleus_*,_std::default_delete<trento::Nucleus>_>)
         in_RDI.super___uniq_ptr_impl<trento::Nucleus,_std::default_delete<trento::Nucleus>_>._M_t.
         super__Tuple_impl<0UL,_trento::Nucleus_*,_std::default_delete<trento::Nucleus>_>.
         super__Head_base<0UL,_trento::Nucleus_*,_false>._M_head_impl;
}

Assistant:

NucleusPtr Nucleus::create(const std::string& species, double nucleon_dmin) {
  // W-S params ref. in header
  // XXX: remember to add new species to the help output in main() and the readme
  if (species == "p")
    return NucleusPtr{new Proton{}};
  else if (species == "d")
    return NucleusPtr{new Deuteron{}};
  else if (species == "Cu")
    return NucleusPtr{new WoodsSaxonNucleus{
       63, 4.20, 0.596, nucleon_dmin
    }};
  else if (species == "Cu2")
    return NucleusPtr{new DeformedWoodsSaxonNucleus{
       63, 4.20, 0.596, 0.162, -0.006, nucleon_dmin
    }};
  else if (species == "Xe")
    return NucleusPtr{new WoodsSaxonNucleus{
      129, 5.36, 0.590, nucleon_dmin
    }};
  else if (species == "Xe2")
    return NucleusPtr{new DeformedWoodsSaxonNucleus{
      129, 5.36, 0.590, 0.162, -0.003, nucleon_dmin
    }};
  else if (species == "Au")
    return NucleusPtr{new WoodsSaxonNucleus{
      197, 6.38, 0.535, nucleon_dmin
    }};
  else if (species == "Au2")
    return NucleusPtr{new DeformedWoodsSaxonNucleus{
      197, 6.38, 0.535, -0.131, -0.031, nucleon_dmin
    }};
  else if (species == "Pb")
    return NucleusPtr{new WoodsSaxonNucleus{
      208, 6.62, 0.546, nucleon_dmin
    }};
  else if (species == "U")
    return NucleusPtr{new DeformedWoodsSaxonNucleus{
      238, 6.81, 0.600, 0.280, 0.093, nucleon_dmin
    }};
  else if (species == "U2")
    return NucleusPtr{new DeformedWoodsSaxonNucleus{
      238, 6.86, 0.420, 0.265, 0.000, nucleon_dmin
    }};
  else if (species == "U3")
    return NucleusPtr{new DeformedWoodsSaxonNucleus{
      238, 6.67, 0.440, 0.280, 0.093, nucleon_dmin
    }};
  // Read nuclear configurations from HDF5.
  else if (hdf5::filename_is_hdf5(species)) {
#ifdef TRENTO_HDF5
    return ManualNucleus::create(species);
#else
    throw std::invalid_argument{"HDF5 output was not compiled"};
#endif  // TRENTO_HDF5
  }
  else
    throw std::invalid_argument{"unknown projectile species: " + species};
}